

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

void __thiscall ContextField::saveXml(ContextField *this,ostream *s)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::operator<<(s,"<contextfield");
  std::operator<<(s," signbit=\"");
  pcVar2 = "false\"";
  if (this->signbit != false) {
    pcVar2 = "true\"";
  }
  std::operator<<(s,pcVar2);
  poVar1 = std::operator<<(s," startbit=\"");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->startbit);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," endbit=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->endbit);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," startbyte=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->startbyte);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," endbyte=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->endbyte);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," shift=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->shift);
  std::operator<<(poVar1,"\"/>\n");
  return;
}

Assistant:

void ContextField::saveXml(ostream &s) const

{
  s << "<contextfield";
  s << " signbit=\"";
  if (signbit)
    s << "true\"";
  else
    s << "false\"";
  s << " startbit=\"" << dec << startbit << "\"";
  s << " endbit=\"" << endbit << "\"";
  s << " startbyte=\"" << startbyte << "\"";
  s << " endbyte=\"" << endbyte << "\"";
  s << " shift=\"" << shift << "\"/>\n";
}